

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

point_t * opengv::triangulation::triangulate
                    (point_t *__return_storage_ptr__,RelativeAdapterBase *adapter,size_t index)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  double dVar8;
  undefined1 *puVar9;
  Index size;
  double *pdVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  ulong uVar13;
  Index IVar14;
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  MatrixXd A;
  bearingVector_t f2;
  bearingVector_t f1;
  Matrix<double,_3,_4,_0,_3,_4> P2;
  Matrix<double,_3,_4,_0,_3,_4> P1;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> mySVD;
  undefined8 auStack_5b8 [66];
  undefined8 uStack_3a8;
  DenseStorage<double,__1,__1,__1,_0> local_3a0;
  ulong local_380;
  double local_378;
  double dStack_370;
  ulong local_360;
  double local_358;
  double dStack_350;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  double local_310;
  double local_308;
  double local_300;
  undefined1 local_2f8 [16];
  double local_2e8;
  undefined8 local_2e0;
  undefined1 local_2d8 [16];
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined1 local_2b8 [16];
  undefined8 local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_270;
  
  auVar29 = *(undefined1 (*) [16])
             (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array;
  auVar3 = *(undefined1 (*) [16])
            ((adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array + 3);
  auVar4 = *(undefined1 (*) [16])
            ((adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array + 6);
  dVar2 = (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[0];
  dVar8 = (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1];
  local_310 = (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
              .m_data.array[2];
  auVar31._8_8_ = 0;
  auVar31._0_8_ = local_310;
  local_308 = (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
              .m_data.array[5];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = local_308;
  dVar1 = (adapter->_t12).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2];
  local_300 = (adapter->_R12).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
              .m_data.array[8];
  uStack_298 = 0;
  uStack_290 = 0;
  uStack_288 = 0;
  local_2d8 = ZEXT416(0) << 0x40;
  local_2e0 = 0x3ff0000000000000;
  local_2c8 = 0;
  local_2c0 = 0x3ff0000000000000;
  local_2a8 = 0;
  local_2a0 = 0x3ff0000000000000;
  local_340 = vunpcklpd_avx(auVar29,auVar3);
  local_320 = vunpckhpd_avx(auVar3,auVar4);
  local_330 = vblendpd_avx(auVar4,auVar29,2);
  auVar31 = vunpcklpd_avx(auVar31,auVar33);
  auVar32._0_8_ = dVar1 * auVar31._0_8_;
  auVar32._8_8_ = dVar1 * auVar31._8_8_;
  auVar29._0_8_ = dVar2 * -auVar29._0_8_ + dVar8 * -auVar29._8_8_;
  auVar29._8_8_ = dVar2 * -auVar3._0_8_ + dVar8 * -auVar3._8_8_;
  local_2f8 = vsubpd_avx(auVar29,auVar32);
  local_2e8 = (dVar2 * -auVar4._0_8_ + dVar8 * -auVar4._8_8_) - dVar1 * local_300;
  uStack_3a8 = 0x16595f;
  local_2b8 = local_2d8;
  (*adapter->_vptr_RelativeAdapterBase[2])(&local_360);
  uStack_3a8 = 0x165970;
  (*adapter->_vptr_RelativeAdapterBase[3])(&local_380,adapter,index);
  local_3a0.m_cols = 0;
  local_3a0.m_data = (double *)0x0;
  local_3a0.m_rows = 0;
  uStack_3a8 = 0x165993;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_3a0,0x10,4,4);
  if (0 < local_3a0.m_cols) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_360;
    auVar15 = vbroadcastsd_avx512f(auVar3);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = dStack_350;
    auVar16 = vbroadcastsd_avx512f(auVar4);
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar18 = vpbroadcastq_avx512f(ZEXT816(0x18));
    auVar19 = vpbroadcastq_avx512f(ZEXT816(8));
    pauVar12 = &local_2d8;
    puVar9 = local_340;
    uVar11 = local_3a0.m_cols + 7U & 0xfffffffffffffff8;
    auVar20 = vpbroadcastq_avx512f();
    auVar21 = vpbroadcastq_avx512f();
    uVar13 = uVar11;
    do {
      vpmullq_avx512dq(auVar17,auVar18);
      uVar7 = vpcmpuq_avx512f(auVar17,auVar20,2);
      auVar22 = vpmullq_avx512dq(auVar17,auVar21);
      auVar17 = vpaddq_avx512f(auVar17,auVar19);
      uVar13 = uVar13 - 8;
      auVar23 = vgatherqpd_avx512f(*(undefined8 *)(local_2d8 + 8 + (long)pauVar12));
      auVar25._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar23._8_8_;
      auVar25._0_8_ = (ulong)((byte)uVar7 & 1) * auVar23._0_8_;
      auVar25._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar23._16_8_;
      auVar25._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar23._24_8_;
      auVar25._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar23._32_8_;
      auVar25._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar23._40_8_;
      auVar25._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar23._48_8_;
      auVar25._56_8_ = (uVar7 >> 7) * auVar23._56_8_;
      auVar23 = vgatherqpd_avx512f(*(undefined8 *)((long)&local_2e0 + (long)pauVar12));
      auVar24._8_8_ = (ulong)((byte)(uVar7 >> 1) & 1) * auVar23._8_8_;
      auVar24._0_8_ = (ulong)((byte)uVar7 & 1) * auVar23._0_8_;
      auVar24._16_8_ = (ulong)((byte)(uVar7 >> 2) & 1) * auVar23._16_8_;
      auVar24._24_8_ = (ulong)((byte)(uVar7 >> 3) & 1) * auVar23._24_8_;
      auVar24._32_8_ = (ulong)((byte)(uVar7 >> 4) & 1) * auVar23._32_8_;
      auVar24._40_8_ = (ulong)((byte)(uVar7 >> 5) & 1) * auVar23._40_8_;
      auVar24._48_8_ = (ulong)((byte)(uVar7 >> 6) & 1) * auVar23._48_8_;
      auVar24._56_8_ = (uVar7 >> 7) * auVar23._56_8_;
      auVar23 = vmulpd_avx512f(auVar15,auVar25);
      auVar25 = vmulpd_avx512f(auVar16,auVar24);
      auVar23 = vsubpd_avx512f(auVar23,auVar25);
      vscatterqpd_avx512f(ZEXT864(local_3a0.m_data) + auVar22 * (undefined1  [64])0x8,uVar7,auVar23)
      ;
    } while (uVar13 != 0);
    pdVar10 = local_3a0.m_data + 1;
    IVar14 = local_3a0.m_cols;
    do {
      auVar29 = vpermilpd_avx(*pauVar12,1);
      pauVar12 = (undefined1 (*) [16])(pauVar12[1] + 8);
      auVar34._0_8_ = local_358 * auVar29._0_8_;
      auVar34._8_8_ = dStack_350 * auVar29._8_8_;
      auVar29 = vhsubpd_avx(auVar34,auVar34);
      dVar1 = (double)vmovlpd_avx(auVar29);
      *pdVar10 = dVar1;
      pdVar10 = pdVar10 + local_3a0.m_rows;
      IVar14 = IVar14 + -1;
    } while (IVar14 != 0);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_380;
    auVar15 = vbroadcastsd_avx512f(auVar5);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dStack_370;
    auVar16 = vbroadcastsd_avx512f(auVar6);
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    pdVar10 = local_3a0.m_data + 2;
    do {
      vpmullq_avx512dq(auVar17,auVar18);
      uVar13 = vpcmpuq_avx512f(auVar17,auVar20,2);
      auVar22 = vpmullq_avx512dq(auVar17,auVar21);
      auVar17 = vpaddq_avx512f(auVar17,auVar19);
      uVar11 = uVar11 - 8;
      auVar23 = vgatherqpd_avx512f(*(undefined8 *)(local_330 + (long)pdVar10));
      auVar26._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * auVar23._8_8_;
      auVar26._0_8_ = (ulong)((byte)uVar13 & 1) * auVar23._0_8_;
      auVar26._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * auVar23._16_8_;
      auVar26._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * auVar23._24_8_;
      auVar26._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * auVar23._32_8_;
      auVar26._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * auVar23._40_8_;
      auVar26._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * auVar23._48_8_;
      auVar26._56_8_ = (uVar13 >> 7) * auVar23._56_8_;
      auVar23 = vgatherqpd_avx512f(*(undefined8 *)(local_340 + (long)pdVar10));
      auVar27._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * auVar23._8_8_;
      auVar27._0_8_ = (ulong)((byte)uVar13 & 1) * auVar23._0_8_;
      auVar27._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * auVar23._16_8_;
      auVar27._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * auVar23._24_8_;
      auVar27._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * auVar23._32_8_;
      auVar27._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * auVar23._40_8_;
      auVar27._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * auVar23._48_8_;
      auVar27._56_8_ = (uVar13 >> 7) * auVar23._56_8_;
      auVar23 = vmulpd_avx512f(auVar15,auVar26);
      auVar25 = vmulpd_avx512f(auVar16,auVar27);
      auVar23 = vsubpd_avx512f(auVar23,auVar25);
      vscatterqpd_avx512f(ZEXT864(pdVar10) + auVar22 * (undefined1  [64])0x8,uVar13,auVar23);
    } while (uVar11 != 0);
    pdVar10 = local_3a0.m_data + 3;
    IVar14 = local_3a0.m_cols;
    do {
      auVar29 = vpermilpd_avx(*(undefined1 (*) [16])(puVar9 + 8),1);
      puVar9 = ((undefined1 (*) [16])(puVar9 + 8))[1];
      auVar28._0_8_ = local_378 * auVar29._0_8_;
      auVar28._8_8_ = dStack_370 * auVar29._8_8_;
      auVar29 = vhsubpd_avx(auVar28,auVar28);
      dVar1 = (double)vmovlpd_avx(auVar29);
      *pdVar10 = dVar1;
      pdVar10 = pdVar10 + local_3a0.m_rows;
      IVar14 = IVar14 + -1;
    } while (IVar14 != 0);
  }
  uStack_3a8 = 0x165b4a;
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_270,(MatrixType *)&local_3a0,0x10);
  auVar29 = *(undefined1 (*) [16])
             (local_270.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data + local_270.
                       super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                       .m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_rows * 3);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar29;
  dVar1 = local_270.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
          m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[local_270.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 3 + 3];
  auVar30._8_8_ = dVar1;
  auVar30._0_8_ = dVar1;
  dVar2 = local_270.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
          m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_data[local_270.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixV.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows * 3 + 2];
  auVar29 = vdivpd_avx(auVar29,auVar30);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
   m_data.array = auVar29;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar2 / dVar1;
  uStack_3a8 = 0x165b89;
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_270);
  if (local_3a0.m_data != (double *)0x0) {
    uStack_3a8 = 0x165b9b;
    free((void *)local_3a0.m_data[-1]);
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::point_t
opengv::triangulation::triangulate(
    const relative_pose::RelativeAdapterBase & adapter,
    size_t index )
{
  translation_t t12 = adapter.gett12();
  rotation_t R12 = adapter.getR12();
  Eigen::Matrix<double,3,4> P1 = Eigen::Matrix<double,3,4>::Zero();
  P1.block<3,3>(0,0) = Eigen::Matrix3d::Identity();
  Eigen::Matrix<double,3,4> P2 = Eigen::Matrix<double,3,4>::Zero();
  P2.block<3,3>(0,0) = R12.transpose();
  P2.block<3,1>(0,3) = -R12.transpose()*t12;
  bearingVector_t f1 = adapter.getBearingVector1(index);
  bearingVector_t f2 = adapter.getBearingVector2(index);

  Eigen::MatrixXd A(4,4);
  A.row(0) = f1[0] * P1.row(2) - f1[2] * P1.row(0);
  A.row(1) = f1[1] * P1.row(2) - f1[2] * P1.row(1);
  A.row(2) = f2[0] * P2.row(2) - f2[2] * P2.row(0);
  A.row(3) = f2[1] * P2.row(2) - f2[2] * P2.row(1);

  Eigen::JacobiSVD< Eigen::MatrixXd > mySVD(A, Eigen::ComputeFullV );
  point_t worldPoint;
  worldPoint[0] = mySVD.matrixV()(0,3);
  worldPoint[1] = mySVD.matrixV()(1,3);
  worldPoint[2] = mySVD.matrixV()(2,3);
  worldPoint = worldPoint / mySVD.matrixV()(3,3);

  return worldPoint;
}